

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void delete_insn_data(MIR_insn_t insn)

{
  void *__ptr;
  void *__ptr_00;
  HTAB_MIR_item_t *pHVar1;
  bb_insn_t pbVar2;
  dead_var_t pdVar3;
  dead_var_t_conflict pdVar4;
  long lVar5;
  MIR_item_t pMVar6;
  size_t sVar7;
  bitmap_t pVVar8;
  bb_t_conflict bb;
  uint uVar9;
  MIR_context_t pMVar10;
  DLIST_LINK_bb_insn_t *pDVar11;
  DLIST_LINK_dead_var_t *pDVar12;
  DLIST_dead_var_t *pDVar13;
  DLIST_LINK_MIR_item_t *pDVar14;
  VARR_void_ptr_t *pVVar15;
  HTAB_MIR_item_t **ppHVar16;
  FILE *pFVar17;
  size_t *rpost;
  MIR_context_t in_RSI;
  MIR_context_t pMVar18;
  VARR_uint8_t *dv;
  gen_ctx_t pgVar19;
  gen_ctx_t __ptr_01;
  
  __ptr = insn->data;
  if (((__ptr == (void *)0x0) || (uVar9 = *(int *)&insn->field_0x18 - 0xa7, 0xd < uVar9)) ||
     ((0x2007U >> (uVar9 & 0x1f) & 1) == 0)) {
    return;
  }
  if ((2 < uVar9) || (__ptr_00 = *(void **)((long)__ptr + 8), __ptr_00 == (void *)0x0)) {
LAB_0015f9df:
    free(__ptr);
    return;
  }
  pgVar19 = *(gen_ctx_t *)((long)__ptr_00 + 0x10);
  if (pgVar19 != (gen_ctx_t)0x0) {
    free(pgVar19);
    free(__ptr_00);
    goto LAB_0015f9df;
  }
  delete_insn_data_cold_1();
  DLIST_bb_insn_t_remove(&((bb_t_conflict)in_RSI->temp_string)->bb_insns,(bb_insn_t_conflict)in_RSI)
  ;
  in_RSI->gen_ctx->ctx = (MIR_context_t)0x0;
  pMVar18 = in_RSI;
  clear_bb_insn_dead_vars(pgVar19,(bb_insn_t_conflict)in_RSI);
  pHVar1 = in_RSI->module_item_tab;
  if (pHVar1 == (HTAB_MIR_item_t *)0x0) {
LAB_0015fa46:
    free(in_RSI);
    return;
  }
  pgVar19 = (gen_ctx_t)pHVar1->arg;
  if (pgVar19 != (gen_ctx_t)0x0) {
    free(pgVar19);
    free(pHVar1);
    goto LAB_0015fa46;
  }
  delete_bb_insn_cold_1();
  if ((pgVar19 != (gen_ctx_t)0x0) && (pMVar18 != (MIR_context_t)0x0)) {
    pbVar2 = ((DLIST_LINK_bb_insn_t *)&pMVar18->insn_nops)->prev;
    if (pbVar2 == (bb_insn_t)0x0) {
      if (pgVar19->ctx != pMVar18) goto LAB_0015fab2;
      pMVar10 = (MIR_context_t)pMVar18->unspec_protos;
      pgVar19->ctx = pMVar10;
    }
    else {
      pMVar10 = (MIR_context_t)pMVar18->unspec_protos;
      (pbVar2->bb_insn_link).next = (bb_insn_t)pMVar10;
    }
    if (pMVar10 == (MIR_context_t)0x0) {
      if (*(MIR_context_t *)&pgVar19->optimize_level != pMVar18) goto LAB_0015fab7;
      pDVar11 = (DLIST_LINK_bb_insn_t *)&pgVar19->optimize_level;
    }
    else {
      pDVar11 = (DLIST_LINK_bb_insn_t *)&pMVar10->insn_nops;
    }
    pDVar11->prev = pbVar2;
    ((DLIST_LINK_bb_insn_t *)&pMVar18->insn_nops)->prev = (bb_insn_t)0x0;
    pMVar18->unspec_protos = (VARR_MIR_proto_t *)0x0;
    return;
  }
  DLIST_bb_insn_t_remove_cold_1();
LAB_0015fab2:
  DLIST_bb_insn_t_remove_cold_2();
LAB_0015fab7:
  DLIST_bb_insn_t_remove_cold_3();
  dv = (VARR_uint8_t *)((DLIST_dead_var_t *)&pMVar18->temp_data)->head;
  if (dv != (VARR_uint8_t *)0x0) {
    __ptr_01 = pgVar19;
    do {
      pdVar3 = ((DLIST_LINK_dead_var_t *)&dv->size)->prev;
      pdVar4 = (dead_var_t_conflict)dv->varr;
      pDVar13 = (DLIST_dead_var_t *)&(pdVar3->dead_var_link).next;
      if (pdVar3 == (dead_var_t)0x0) {
        pDVar13 = (DLIST_dead_var_t *)&pMVar18->temp_data;
      }
      pDVar13->head = pdVar4;
      if (pdVar4 == (dead_var_t_conflict)0x0) {
        pDVar12 = (DLIST_LINK_dead_var_t *)&pMVar18->used_label_p;
        if (pMVar18->used_label_p != dv) {
          clear_bb_insn_dead_vars_cold_1();
          pdVar3 = (__ptr_01->free_dead_vars).tail;
          if (pdVar3 == (dead_var_t)0x0) {
            if ((__ptr_01->free_dead_vars).head == (dead_var_t_conflict)0x0) {
              pDVar13 = &__ptr_01->free_dead_vars;
              goto LAB_0015fb56;
            }
          }
          else {
            if ((pdVar3->dead_var_link).next == (dead_var_t)0x0) {
              pDVar13 = (DLIST_dead_var_t *)&(pdVar3->dead_var_link).next;
LAB_0015fb56:
              pDVar13->head = (dead_var_t_conflict)dv;
              dv->varr = (uint8_t *)0x0;
              ((DLIST_LINK_dead_var_t *)&dv->size)->prev = pdVar3;
              (__ptr_01->free_dead_vars).tail = (dead_var_t_conflict)dv;
              return;
            }
            free_dead_var_cold_1();
          }
          free_dead_var_cold_2();
          pMVar18 = __ptr_01->ctx;
          pHVar1 = *(HTAB_MIR_item_t **)&__ptr_01->debug_level;
          if (pHVar1 != (HTAB_MIR_item_t *)0x0) {
            pVVar15 = __ptr_01->to_free;
            pHVar1->free_func = (_func_void_MIR_item_t_void_ptr *)pVVar15;
LAB_0015fb9d:
            if (pVVar15 == (VARR_void_ptr_t *)0x0) {
              if ((gen_ctx_t)pMVar18->module_item_tab != __ptr_01) goto LAB_0015fc0f;
              ppHVar16 = &pMVar18->module_item_tab;
            }
            else {
              ppHVar16 = (HTAB_MIR_item_t **)&pVVar15[1].size;
            }
            *ppHVar16 = pHVar1;
            *(undefined8 *)&__ptr_01->debug_level = 0;
            __ptr_01->to_free = (VARR_void_ptr_t *)0x0;
            lVar5 = *(long *)&__ptr_01->optimize_level;
            pMVar6 = __ptr_01->curr_func_item;
            if (pMVar6 == (MIR_item_t)0x0) {
              if (*(gen_ctx_t *)(lVar5 + 0x30) != __ptr_01) goto LAB_0015fc14;
              pFVar17 = __ptr_01->debug_file;
              *(FILE **)(lVar5 + 0x30) = pFVar17;
            }
            else {
              pFVar17 = __ptr_01->debug_file;
              (pMVar6->item_link).next = (MIR_item_t)pFVar17;
            }
            if (pFVar17 == (FILE *)0x0) {
              if (*(gen_ctx_t *)(lVar5 + 0x38) != __ptr_01) goto LAB_0015fc19;
              pDVar14 = (DLIST_LINK_MIR_item_t *)(lVar5 + 0x38);
            }
            else {
              pDVar14 = (DLIST_LINK_MIR_item_t *)&pFVar17->_IO_read_end;
            }
            pDVar14->prev = pMVar6;
            free(__ptr_01);
            return;
          }
          if ((gen_ctx_t)pMVar18->used_label_p == __ptr_01) {
            pVVar15 = __ptr_01->to_free;
            pMVar18->used_label_p = (VARR_uint8_t *)pVVar15;
            goto LAB_0015fb9d;
          }
          delete_edge_cold_1();
LAB_0015fc0f:
          delete_edge_cold_2();
LAB_0015fc14:
          delete_edge_cold_3();
LAB_0015fc19:
          delete_edge_cold_4();
          sVar7 = dv->els_num;
          dv->els_num = sVar7 + 1;
          *(size_t *)&__ptr_01->optimize_level = sVar7;
          for (pVVar8 = __ptr_01->addr_regs; pVVar8 != (bitmap_t)0x0;
              pVVar8 = (bitmap_t)pVVar8[1].varr) {
            bb = (bb_t_conflict)pVVar8->size;
            if (bb->pre == 0) {
              DFS(bb,&dv->els_num,rpost);
            }
            else if (bb->rpost == 0) {
              *(undefined1 *)((long)&pVVar8[2].els_num + 1) = 1;
            }
          }
          pMVar6 = (MIR_item_t)*rpost;
          *rpost = (size_t)((long)&pMVar6[-1].u + 7);
          __ptr_01->curr_func_item = pMVar6;
          return;
        }
      }
      else {
        pDVar12 = &pdVar4->dead_var_link;
      }
      pDVar12->prev = pdVar3;
      ((DLIST_LINK_dead_var_t *)&dv->size)->prev = (dead_var_t)0x0;
      dv->varr = (uint8_t *)0x0;
      __ptr_01 = pgVar19;
      free_dead_var(pgVar19,(dead_var_t_conflict)dv);
      dv = (VARR_uint8_t *)((DLIST_dead_var_t *)&pMVar18->temp_data)->head;
    } while (dv != (VARR_uint8_t *)0x0);
  }
  return;
}

Assistant:

static void delete_insn_data (MIR_insn_t insn) {
  insn_data_t insn_data = insn->data;

  if (insn_data == NULL || !insn_data_p (insn)) return;
  if (MIR_call_code_p (insn->code) && insn_data->u.call_hard_reg_args != NULL)
    bitmap_destroy (insn_data->u.call_hard_reg_args);
  free (insn_data);
}